

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O3

void SPARSITY_INFO(int *nJdata,int *consP,int NCELLS)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  int k_1;
  long lVar7;
  int k;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  int iVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  int iVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  GpuArray<double,_9U> conc;
  Real h_RT [9];
  Real c_R [9];
  Real dcRdT [9];
  double local_6f8 [9];
  double adStack_6b0 [15];
  undefined1 local_638 [16];
  undefined1 local_628 [16];
  undefined8 local_618;
  double local_608;
  double local_5f8;
  double local_5e8;
  double local_5d8;
  undefined8 uStack_5d0;
  double local_5c8;
  double local_5b8;
  double local_5a8;
  double dStack_5a0;
  double local_598;
  double dStack_590;
  double local_588;
  double dStack_580;
  double local_578;
  double dStack_570;
  undefined8 local_568;
  double local_558;
  double dStack_550;
  double local_548;
  undefined8 uStack_540;
  double local_538;
  double dStack_530;
  double local_528;
  undefined8 uStack_520;
  double local_510;
  double local_508;
  double local_500;
  double local_4f8;
  double dStack_4f0;
  double local_4e8;
  double dStack_4e0;
  double dStack_4d8;
  double local_4d0;
  double local_4c8;
  double local_4c0 [2];
  double adStack_4b0 [90];
  double local_1e0;
  double local_1d8;
  undefined8 uStack_1d0;
  double local_1c8;
  undefined8 uStack_1c0;
  double local_1b8;
  undefined8 uStack_1b0;
  double local_1a8;
  undefined8 uStack_1a0;
  double local_198;
  double dStack_190;
  double local_188;
  undefined8 uStack_180;
  double local_178;
  undefined8 uStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  double dStack_150;
  double local_148;
  undefined8 uStack_140;
  double local_138;
  undefined8 uStack_130;
  double local_128 [10];
  double local_d8 [10];
  double local_88;
  double dStack_80;
  double local_78 [10];
  
  adStack_6b0[7] = 0.0;
  adStack_6b0[8] = 0.0;
  adStack_6b0[5] = 0.0;
  adStack_6b0[6] = 0.0;
  adStack_6b0[3] = 0.0;
  adStack_6b0[4] = 0.0;
  adStack_6b0[1] = 0.0;
  adStack_6b0[2] = 0.0;
  adStack_6b0[9] = 0.0;
  lVar4 = 1;
  auVar20 = _DAT_0065b9a0;
  do {
    if (SUB164(auVar20 ^ _DAT_0065b9b0,4) == -0x80000000 &&
        SUB164(auVar20 ^ _DAT_0065b9b0,0) < -0x7ffffff7) {
      adStack_6b0[lVar4] = 0.1111111111111111;
      adStack_6b0[lVar4 + 1] = 0.1111111111111111;
    }
    lVar7 = auVar20._8_8_;
    auVar20._0_8_ = auVar20._0_8_ + 2;
    auVar20._8_8_ = lVar7 + 2;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0xb);
  iVar23 = *consP;
  pdVar6 = &local_4f8;
  lVar4 = 0;
  memset(pdVar6,0,800);
  dVar36 = adStack_6b0[4];
  dVar37 = adStack_6b0[2];
  local_628 = (undefined1  [16])0x0;
  local_638 = (undefined1  [16])0x0;
  adStack_6b0[0xd] = 0.0;
  adStack_6b0[0xe] = 0.0;
  adStack_6b0[0xb] = 0.0;
  adStack_6b0[0xc] = 0.0;
  local_618 = 0;
  dVar33 = 0.0;
  do {
    dVar33 = dVar33 + adStack_6b0[lVar4 + 1];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 9);
  local_5a8 = 2.911342024497792;
  dStack_5a0 = 3.254512984911126;
  local_598 = -15.528347679998124;
  dStack_590 = 19.481084666666668;
  local_588 = 22.009669090999374;
  dStack_580 = 5.94295186894925;
  local_578 = 5.3818731557687505;
  dStack_570 = -5.101694818407498;
  local_568 = 0x4008a2a8a3a0d57d;
  local_5d8 = adStack_6b0[1];
  uStack_5d0 = 0;
  local_5e8 = adStack_6b0[3];
  dVar34 = adStack_6b0[3] * 10.0 + adStack_6b0[2] * -0.21999999999999997 + dVar33 + adStack_6b0[1];
  dVar24 = adStack_6b0[2] * adStack_6b0[4];
  dVar8 = ((dVar34 * 1e-12) / 118698922.25997423) * 1838773899538452.5;
  dVar25 = dVar8 + 1.0;
  local_5f8 = -0.0006207345732258481 / dVar25;
  dVar9 = log10(dVar8);
  local_608 = exp(-1.5e+33);
  local_608 = local_608 * 0.19999999999999996;
  local_528 = local_608 + 0.8;
  local_5c8 = log10(local_528);
  local_538 = local_5c8 * -1.27 + 0.75;
  dVar9 = local_5c8 * -0.67 + -0.4 + dVar9;
  dVar35 = 1.0 / (dVar9 * -0.14 + local_538);
  local_5b8 = dVar9 * dVar35;
  local_548 = 1.0 / (local_5b8 * local_5b8 + 1.0);
  dVar10 = pow(10.0,local_5c8 * local_548);
  dVar9 = adStack_6b0[8];
  dVar45 = (local_5c8 + local_5c8) * local_548 * local_548 * local_5b8 * dVar35;
  dVar35 = -local_538 * dVar45 * dVar35;
  dVar10 = dVar10 * (dVar8 / dVar25);
  dVar46 = (dVar24 * 118698922.25997423 + adStack_6b0[7] * -11503468.582662737) * dVar10;
  dVar8 = (dVar24 * 47479.56890398969 + adStack_6b0[7] * -130017.75806443932) * dVar10 +
          (dVar35 * -0.0006207345732258481 +
           (dVar45 * local_5b8 * -1.27 + dVar35 * -0.67 + local_548) *
           (local_608 / -1e-30 + -8e-31) * (0.43429448190325176 / local_528) + local_5f8) *
          2.302585092994046 * dVar46;
  dVar45 = 0.0 - dVar46;
  adStack_6b0[0xc] = dVar45;
  adStack_6b0[0xe] = dVar45;
  local_628._0_8_ = dVar46 + 0.0;
  dVar60 = dVar10 * 118698922.25997423;
  dVar10 = dVar10 * 11503468.582662737;
  dVar35 = (1.0 / dVar25 + dVar35) * (dVar46 / dVar34);
  if (iVar23 == 0) {
    local_6f8[0] = dVar35 + dVar35;
    local_6f8[1] = dVar35 * 0.78 + dVar60 * dVar36;
    local_6f8[2] = dVar35 * 11.0;
    local_6f8[3] = dVar60 * dVar37 + dVar35;
    local_6f8[4] = dVar35;
    local_6f8[5] = dVar35;
    local_6f8[6] = dVar35 - dVar10;
    local_6f8[7] = dVar35;
    local_6f8[8] = dVar35;
    pdVar5 = &dStack_4f0;
    lVar4 = 0;
    do {
      dVar35 = local_6f8[lVar4];
      *pdVar5 = *pdVar5 - dVar35;
      pdVar5[2] = pdVar5[2] - dVar35;
      pdVar5[5] = dVar35 + pdVar5[5];
      lVar4 = lVar4 + 1;
      pdVar5 = pdVar5 + 10;
    } while (lVar4 != 9);
    uVar43 = SUB84(adStack_4b0[0x54],0);
    uVar44 = (undefined4)((ulong)adStack_4b0[0x54] >> 0x20);
  }
  else {
    dStack_4f0 = 0.0 - dVar35;
    local_4c8 = dVar35 + 0.0;
    dVar25 = dVar35 * -0.21999999999999997 + dVar60 * dVar36;
    adStack_4b0[2] = 0.0 - dVar25;
    adStack_4b0[7] = dVar25 + 0.0;
    adStack_4b0[0xc] = 0.0 - dVar35 * 10.0;
    adStack_4b0[0x11] = dVar35 * 10.0 + 0.0;
    adStack_4b0[0x16] = 0.0 - dVar60 * dVar37;
    adStack_4b0[0x1b] = dVar60 * dVar37 + 0.0;
    adStack_4b0[0x39] = 0.0 - dVar10;
    adStack_4b0[0x34] = dVar10 + 0.0;
    uVar43 = 0;
    uVar44 = 0;
    adStack_4b0[0x52] = 0.0;
    adStack_4b0[0x57] = 0.0;
    dStack_4e0 = dStack_4f0;
    adStack_4b0[4] = adStack_4b0[2];
    adStack_4b0[0xe] = adStack_4b0[0xc];
    adStack_4b0[0x18] = adStack_4b0[0x16];
    adStack_4b0[0x36] = adStack_4b0[0x34];
  }
  dVar35 = adStack_4b0[0x52] - dVar8;
  local_558 = (double)CONCAT44(uVar44,uVar43) - dVar8;
  adStack_4b0[0x57] = adStack_4b0[0x57] + dVar8;
  local_528 = local_5e8 * 11.0 + local_5d8 * 1.5 + dVar33;
  uStack_520 = 0;
  dVar33 = ((local_528 * 1e-06) / 25936106.98548031) * 28231227327.532616;
  adStack_4b0[0x52] = dVar35;
  adStack_4b0[0x54] = local_558;
  dVar8 = log10(dVar33);
  local_5f8 = exp(-1.5e+33);
  local_5f8 = local_5f8 * 0.5;
  local_608 = local_5f8 + 0.5;
  local_5c8 = log10(local_608);
  local_538 = local_5c8 * -1.27 + 0.75;
  dVar8 = local_5c8 * -0.67 + -0.4 + dVar8;
  dVar10 = 1.0 / (dVar8 * -0.14 + local_538);
  local_5b8 = dVar8 * dVar10;
  local_548 = 1.0 / (local_5b8 * local_5b8 + 1.0);
  dVar8 = pow(10.0,local_5c8 * local_548);
  dVar46 = (local_5c8 + local_5c8) * local_548 * local_548 * local_5b8 * dVar10;
  dVar10 = -local_538 * dVar46 * dVar10;
  dVar34 = dVar33 + 1.0;
  dVar8 = (dVar33 / dVar34) * dVar8;
  dVar25 = (dVar9 * 25936106.98548031 + adStack_6b0[6] * adStack_6b0[6] * -3419315.29664768) * dVar8
  ;
  dVar9 = (dVar9 * 280925.8837546357 + adStack_6b0[6] * adStack_6b0[6] * -591.7471466541167) * dVar8
          + (dVar10 * -0.0002845931413337665 +
             (dVar46 * local_5b8 * -1.27 + dVar10 * -0.67 + local_548) *
             (local_5f8 / -1e-30 + -4.9999999999999995e-31) * (0.43429448190325176 / local_608) +
            -0.0002845931413337665 / dVar34) * 2.302585092994046 * dVar25;
  dVar33 = dVar25 + dVar25 + 0.0;
  local_638._8_8_ = dVar33;
  local_628._8_8_ = 0.0 - dVar25;
  local_6f8[1] = (1.0 / dVar34 + dVar10) * (dVar25 / local_528);
  dVar10 = dVar8 * 25936106.98548031;
  if (iVar23 == 0) {
    local_6f8[0] = local_6f8[1] * 2.5;
    local_6f8[2] = local_6f8[1] * 12.0;
    local_6f8[3] = local_6f8[1];
    local_6f8[4] = local_6f8[1];
    local_6f8[5] = dVar8 * 3419315.29664768 * -2.0 * adStack_6b0[6] + local_6f8[1];
    local_6f8[6] = local_6f8[1];
    local_6f8[7] = dVar10 + local_6f8[1];
    local_6f8[8] = local_6f8[1];
    pdVar5 = local_4c0;
    lVar4 = 0;
    do {
      dVar8 = local_6f8[lVar4];
      pdVar5[-2] = dVar8 + dVar8 + pdVar5[-2];
      *pdVar5 = *pdVar5 - dVar8;
      lVar4 = lVar4 + 1;
      pdVar5 = pdVar5 + 10;
    } while (lVar4 != 9);
  }
  else {
    dVar34 = local_6f8[1] * 1.5;
    local_4d0 = dVar34 + dVar34 + local_4d0;
    local_4c0[0] = local_4c0[0] - dVar34;
    local_6f8[1] = local_6f8[1] * 11.0;
    adStack_4b0[0x10] = local_6f8[1] + local_6f8[1] + adStack_4b0[0x10];
    adStack_4b0[0x12] = adStack_4b0[0x12] - local_6f8[1];
    dVar8 = dVar8 * 3419315.29664768 * -2.0 * adStack_6b0[6];
    adStack_4b0[0x2e] = dVar8 + dVar8 + adStack_4b0[0x2e];
    adStack_4b0[0x30] = adStack_4b0[0x30] - dVar8;
    adStack_4b0[0x42] = dVar10 + dVar10 + adStack_4b0[0x42];
    adStack_4b0[0x44] = adStack_4b0[0x44] - dVar10;
  }
  adStack_4b0[0x56] = dVar9 + dVar9 + adStack_4b0[0x56];
  adStack_4b0[0x58] = adStack_4b0[0x58] - dVar9;
  local_6f8[1] = local_5d8 * 1.0145869685785861e-06 + dVar36 * dVar36 * -407.1662961015109;
  dVar8 = local_528 * local_6f8[1];
  dVar9 = (local_5d8 * 2.2738361995042403e-08 + dVar36 * dVar36 * 0.38915785318430907) * local_528;
  adStack_6b0[0xb] = 0.0 - dVar8;
  adStack_6b0[0xe] = dVar8 + dVar8 + dVar45;
  if (iVar23 == 0) {
    local_6f8[0] = local_6f8[1] * 2.5 + local_528 * 1.0145869685785861e-06;
    local_6f8[2] = local_6f8[1] * 12.0;
    local_6f8[3] = local_528 * 407.1662961015109 * -2.0 * dVar36 + local_6f8[1];
    local_6f8[6] = local_6f8[1];
    local_6f8[7] = local_6f8[1];
    local_6f8[4] = local_6f8[1];
    local_6f8[5] = local_6f8[1];
    local_6f8[8] = local_6f8[1];
    pdVar5 = &local_4f8;
    lVar4 = 0;
    do {
      dVar10 = local_6f8[lVar4];
      *pdVar5 = *pdVar5 - dVar10;
      pdVar5[3] = dVar10 + dVar10 + pdVar5[3];
      lVar4 = lVar4 + 1;
      pdVar5 = pdVar5 + 10;
      local_558 = adStack_4b0[0x54];
    } while (lVar4 != 9);
  }
  else {
    dVar10 = local_6f8[1] * 1.5 + local_528 * 1.0145869685785861e-06;
    local_4f8 = 0.0 - dVar10;
    dStack_4e0 = dVar10 + dVar10 + dStack_4e0;
    local_6f8[1] = local_6f8[1] * 11.0;
    adStack_4b0[0xb] = 0.0 - local_6f8[1];
    adStack_4b0[0xe] = local_6f8[1] + local_6f8[1] + adStack_4b0[0xe];
    dVar10 = local_528 * 407.1662961015109 * -2.0 * dVar36;
    adStack_4b0[0x15] = 0.0 - dVar10;
    adStack_4b0[0x18] = dVar10 + dVar10 + adStack_4b0[0x18];
    adStack_4b0[0x51] = 0.0;
  }
  adStack_4b0[0x51] = adStack_4b0[0x51] - dVar9;
  adStack_4b0[0x54] = dVar9 + dVar9 + local_558;
  local_6f8[3] = adStack_6b0[5] * adStack_6b0[5] * 159.17961552912485 +
                 dVar37 * -2.0846475553480232e-08;
  dVar9 = local_528 * local_6f8[3];
  dVar34 = (adStack_6b0[5] * adStack_6b0[5] * -0.05305987184304161 + dVar37 * -5.456888123885079e-10
           ) * local_528;
  adStack_6b0[0xc] = dVar45 + dVar9;
  dVar46 = local_528 * 159.17961552912485;
  dVar10 = local_528 * 2.0846475553480232e-08;
  if (iVar23 == 0) {
    local_6f8[0] = local_6f8[3] * 2.5;
    local_6f8[1] = local_6f8[3] - dVar10;
    local_6f8[2] = local_6f8[3] * 12.0;
    local_6f8[4] = (dVar46 + dVar46) * adStack_6b0[5] + local_6f8[3];
    local_6f8[7] = local_6f8[3];
    local_6f8[8] = local_6f8[3];
    local_6f8[5] = local_6f8[3];
    local_6f8[6] = local_6f8[3];
    pdVar5 = &dStack_4f0;
    lVar4 = 0;
    do {
      dVar35 = local_6f8[lVar4];
      *pdVar5 = *pdVar5 + dVar35;
      pdVar5[3] = pdVar5[3] - (dVar35 + dVar35);
      lVar4 = lVar4 + 1;
      pdVar5 = pdVar5 + 10;
    } while (lVar4 != 9);
  }
  else {
    dVar60 = local_6f8[3] * 1.5;
    dStack_4f0 = dStack_4f0 + dVar60;
    dStack_4d8 = 0.0 - (dVar60 + dVar60);
    adStack_4b0[2] = adStack_4b0[2] - dVar10;
    adStack_4b0[5] = 0.0 - dVar10 * -2.0;
    local_6f8[3] = local_6f8[3] * 11.0;
    adStack_4b0[0xc] = adStack_4b0[0xc] + local_6f8[3];
    adStack_4b0[0xf] = 0.0 - (local_6f8[3] + local_6f8[3]);
    dVar10 = (dVar46 + dVar46) * adStack_6b0[5];
    adStack_4b0[0x20] = adStack_4b0[0x20] + dVar10;
    adStack_4b0[0x23] = 0.0 - (dVar10 + dVar10);
    adStack_4b0[0x55] = 0.0;
    adStack_4b0[0x52] = dVar35;
  }
  dVar35 = adStack_4b0[0x52] + dVar34;
  adStack_4b0[0x52] = dVar35;
  adStack_4b0[0x55] = adStack_4b0[0x55] - (dVar34 + dVar34);
  local_6f8[1] = dVar36 * adStack_6b0[5] * 3142.6666666666665 +
                 adStack_6b0[6] * -5.646680545093694e-06;
  local_638._8_8_ = local_528 * local_6f8[1];
  dVar10 = (dVar36 * adStack_6b0[5] * -2.095111111111111 + adStack_6b0[6] * -1.262891468371164e-07)
           * local_528;
  adStack_6b0[0xe] = adStack_6b0[0xe] - (double)local_638._8_8_;
  local_638._0_8_ = (0.0 - (dVar9 + dVar9)) - (double)local_638._8_8_;
  local_638._8_8_ = (double)local_638._8_8_ + dVar33;
  dVar34 = local_528 * 3142.6666666666665;
  dVar33 = local_528 * 5.646680545093694e-06;
  if (iVar23 == 0) {
    local_6f8[0] = local_6f8[1] * 2.5;
    local_6f8[2] = local_6f8[1] * 12.0;
    local_6f8[3] = local_6f8[1] + adStack_6b0[5] * dVar34;
    local_6f8[4] = local_6f8[1] + dVar36 * dVar34;
    local_6f8[5] = local_6f8[1] - dVar33;
    local_6f8[6] = local_6f8[1];
    local_6f8[7] = local_6f8[1];
    local_6f8[8] = local_6f8[1];
    pdVar5 = &local_4d0;
    lVar4 = 0;
    do {
      dVar33 = local_6f8[lVar4];
      pdVar5[-2] = pdVar5[-2] - dVar33;
      pdVar5[-1] = pdVar5[-1] - dVar33;
      *pdVar5 = dVar33 + *pdVar5;
      lVar4 = lVar4 + 1;
      pdVar5 = pdVar5 + 10;
    } while (lVar4 != 9);
  }
  else {
    dVar46 = local_6f8[1] * 1.5;
    dStack_4e0 = dStack_4e0 - dVar46;
    dStack_4d8 = dStack_4d8 - dVar46;
    local_4d0 = dVar46 + local_4d0;
    local_6f8[1] = local_6f8[1] * 11.0;
    adStack_4b0[0xe] = adStack_4b0[0xe] - local_6f8[1];
    adStack_4b0[0xf] = adStack_4b0[0xf] - local_6f8[1];
    adStack_4b0[0x10] = local_6f8[1] + adStack_4b0[0x10];
    dVar46 = dVar34 * adStack_6b0[5];
    adStack_4b0[0x18] = adStack_4b0[0x18] - dVar46;
    adStack_4b0[0x19] = adStack_4b0[0x19] - dVar46;
    adStack_4b0[0x1a] = dVar46 + adStack_4b0[0x1a];
    dVar34 = dVar34 * dVar36;
    adStack_4b0[0x22] = adStack_4b0[0x22] - dVar34;
    adStack_4b0[0x23] = adStack_4b0[0x23] - dVar34;
    adStack_4b0[0x24] = dVar34 + adStack_4b0[0x24];
    adStack_4b0[0x2c] = dVar33 + adStack_4b0[0x2c];
    adStack_4b0[0x2d] = dVar33 + adStack_4b0[0x2d];
    adStack_4b0[0x2e] = adStack_4b0[0x2e] - dVar33;
  }
  adStack_4b0[0x54] = adStack_4b0[0x54] - dVar10;
  dVar60 = adStack_4b0[0x55] - dVar10;
  adStack_4b0[0x55] = dVar60;
  adStack_4b0[0x56] = dVar10 + adStack_4b0[0x56];
  dVar10 = dVar36 * adStack_6b0[6];
  local_6f8[1] = dVar10 * 16888.888888888887 + local_5e8 * -1.4321870058604512e-06;
  dVar33 = local_528 * local_6f8[1];
  dVar34 = (dVar10 * -22.518518518518515 + local_5e8 * -3.623660767668382e-08) * local_528;
  adStack_6b0[0xe] = adStack_6b0[0xe] - dVar33;
  local_638._8_8_ = (double)local_638._8_8_ - dVar33;
  adStack_6b0[0xd] = dVar33 + 0.0;
  dVar46 = local_528 * 16888.888888888887;
  if (iVar23 == 0) {
    local_6f8[0] = local_6f8[1] * 2.5;
    local_6f8[2] = -(local_528 * 1.4321870058604512e-06) + local_6f8[1] * 12.0;
    local_6f8[3] = local_6f8[1] + adStack_6b0[6] * dVar46;
    local_6f8[4] = local_6f8[1];
    local_6f8[5] = dVar46 * dVar36 + local_6f8[1];
    local_6f8[6] = local_6f8[1];
    local_6f8[7] = local_6f8[1];
    local_6f8[8] = local_6f8[1];
    pdVar5 = &local_4e8;
    lVar4 = 0;
    do {
      dVar46 = local_6f8[lVar4];
      *pdVar5 = *pdVar5 + dVar46;
      pdVar5[1] = pdVar5[1] - dVar46;
      pdVar5[3] = pdVar5[3] - dVar46;
      lVar4 = lVar4 + 1;
      pdVar5 = pdVar5 + 10;
    } while (lVar4 != 9);
  }
  else {
    dVar11 = local_6f8[1] * 1.5;
    local_4e8 = dVar11 + 0.0;
    dStack_4e0 = dStack_4e0 - dVar11;
    local_4d0 = local_4d0 - dVar11;
    dVar11 = local_6f8[1] * 11.0 - local_528 * 1.4321870058604512e-06;
    adStack_4b0[0xd] = dVar11 + 0.0;
    adStack_4b0[0xe] = adStack_4b0[0xe] - dVar11;
    adStack_4b0[0x10] = adStack_4b0[0x10] - dVar11;
    dVar11 = dVar46 * adStack_6b0[6];
    adStack_4b0[0x17] = dVar11 + 0.0;
    adStack_4b0[0x18] = adStack_4b0[0x18] - dVar11;
    adStack_4b0[0x1a] = adStack_4b0[0x1a] - dVar11;
    dVar46 = dVar46 * dVar36;
    adStack_4b0[0x2b] = dVar46 + 0.0;
    adStack_4b0[0x2c] = adStack_4b0[0x2c] - dVar46;
    adStack_4b0[0x2e] = adStack_4b0[0x2e] - dVar46;
    adStack_4b0[0x53] = 0.0;
  }
  dVar68 = dVar24 * 694956.7634748495 + adStack_6b0[5] * adStack_6b0[6] * -9534710.169227276;
  dVar24 = dVar24 * 2391.8538305613447 + adStack_6b0[5] * adStack_6b0[6] * 345.9681317415751;
  dVar36 = dVar36 * 694956.7634748495;
  dVar37 = dVar37 * 694956.7634748495;
  dVar64 = adStack_6b0[5] * -9534710.169227276;
  dStack_530 = (adStack_4b0[0x54] - dVar34) - dVar24;
  dVar69 = adStack_6b0[5] * 1860366.9115799016;
  dStack_4d8 = dStack_4d8 - dVar69;
  dVar67 = adStack_6b0[6] * -1341454.8115373214;
  adStack_4b0[0x19] = (adStack_4b0[0x19] + dVar37) - dVar67;
  dVar26 = adStack_6b0[1] * 1860366.9115799016;
  dVar32 = adStack_6b0[6] * -9534710.169227276;
  adStack_4b0[0x1f] = adStack_4b0[0x1f] - dVar26;
  adStack_4b0[0x22] = (adStack_4b0[0x22] - dVar32) + dVar26;
  dVar52 = adStack_6b0[6] * 4271828.084344627;
  local_4e8 = dVar52 + local_4e8;
  local_4d0 = (dVar69 + local_4d0) - dVar52;
  dVar12 = adStack_6b0[3] * -145376.75098299314;
  dVar47 = adStack_6b0[4] * -1341454.8115373214;
  dVar53 = adStack_6b0[4] * -145376.75098299314;
  dVar57 = adStack_6b0[5] * 86324.17110758815;
  adStack_4b0[0xb] = adStack_4b0[0xb] - dVar53;
  dVar38 = adStack_6b0[1] * 4271828.084344627;
  adStack_4b0[0x29] = (adStack_4b0[0x29] - dVar47) - dVar38;
  adStack_4b0[0xf] = adStack_4b0[0xf] - dVar57;
  dVar54 = adStack_6b0[3] * 86324.17110758815;
  adStack_4b0[0x21] = adStack_4b0[0x21] - dVar54;
  dVar39 = adStack_6b0[6] * -3658126.0115307234;
  dVar40 = adStack_6b0[1] * adStack_6b0[6] * 7577.3366907946565 +
           (0.0017737925172045287 -
           ((dStack_590 + local_598) - (dStack_580 + local_5a8)) * 0.0006666666666666666) *
           -145376.75098299314 * adStack_6b0[4] * adStack_6b0[3];
  dVar42 = local_5d8 * adStack_6b0[5] * 5928.561733942619 +
           (0.0031867701457385282 -
           ((dStack_580 + dStack_590) - (local_588 + local_5a8)) * 0.0006666666666666666) *
           -1341454.8115373214 * dVar10;
  dVar27 = adStack_6b0[2] * -0.32384379658070717;
  dStack_4f0 = dVar27 + dStack_4f0;
  dVar13 = adStack_6b0[7] * 12595057.621245861;
  adStack_4b0[0x16] = dVar13 + (adStack_4b0[0x16] - dVar37);
  dVar46 = adStack_6b0[4] * 12595057.621245861;
  dVar11 = adStack_6b0[7] * 64119709.90701692;
  uStack_540 = 0;
  dVar72 = adStack_6b0[6] * -0.6025543492746578;
  dVar58 = adStack_6b0[6] * -32.62001221218423;
  dVar59 = adStack_6b0[2] * -0.6025543492746578;
  adStack_4b0[5] = (dVar36 + adStack_4b0[5]) - dVar72;
  dVar55 = adStack_6b0[7] * 32500000.0;
  adStack_4b0[0x20] = (adStack_4b0[0x20] - dVar32) + dVar55;
  local_198 = (((adStack_4b0[0x2d] + dVar64) - dVar47) - dVar39) - dVar59;
  dVar48 = adStack_6b0[4] * 64119709.90701692;
  dVar51 = adStack_6b0[5] * 32500000.0;
  dVar71 = adStack_6b0[7] * adStack_6b0[4];
  dVar28 = dVar71 * 12595057.621245861 + adStack_6b0[1] * adStack_6b0[2] * -0.32384379658070717;
  dVar29 = dVar71 * 2318.3152480739177 +
           (0.00018406547375879315 -
           ((local_5a8 + dStack_5a0) - (dStack_590 + local_578)) * 0.0006666666666666666) *
           -0.32384379658070717 * adStack_6b0[1] * adStack_6b0[2];
  dVar14 = dVar71 * 4230.445091721601 +
           (6.597729618328551e-05 -
           ((dStack_580 + dStack_580) - (dStack_590 + local_578)) * 0.0006666666666666666) *
           -16.310006106092114 * adStack_6b0[6] * adStack_6b0[6];
  dVar21 = adStack_6b0[5] * adStack_6b0[7] * 0.0 +
           (0.0 - ((dStack_580 + dStack_5a0) - (local_578 + local_588)) * 0.0006666666666666666) *
           -0.6025543492746578 * adStack_6b0[6] * adStack_6b0[2];
  dVar70 = adStack_6b0[7] * adStack_6b0[6] * 34143562.115192875 +
           adStack_6b0[2] * adStack_6b0[3] * -0.029876205886692417;
  dVar74 = adStack_6b0[7] * adStack_6b0[6] * -3795.2266287524203 +
           (-0.00011115497017997593 -
           ((dStack_5a0 + local_598) - (dStack_580 + local_578)) * 0.0006666666666666666) *
           -0.029876205886692417 * adStack_6b0[2] * adStack_6b0[3];
  dVar61 = adStack_6b0[3] * -0.029876205886692417;
  dVar63 = adStack_6b0[1] * -0.32384379658070717;
  adStack_4b0[1] = dVar63 + adStack_4b0[1];
  adStack_4b0[3] = adStack_4b0[3] + dVar61;
  adStack_4b0[4] = (adStack_4b0[4] - dVar36) - dVar63;
  adStack_4b0[6] = (dVar36 + adStack_4b0[6] + dVar72) - dVar61;
  auVar1._8_4_ = SUB84(adStack_4b0[7] - dVar63,0);
  auVar1._0_8_ = adStack_4b0[6];
  auVar1._12_4_ = (int)((ulong)(adStack_4b0[7] - dVar63) >> 0x20);
  adStack_4b0[7] = auVar1._8_8_;
  dVar15 = adStack_6b0[2] * -0.029876205886692417;
  adStack_4b0[0xc] = adStack_4b0[0xc] + dVar15;
  dVar50 = adStack_6b0[7] * 15085094.926858293;
  dVar16 = adStack_6b0[7] * 34143562.115192875;
  local_168 = ((adStack_4b0[0x2f] - dVar58) - dVar59) - dVar16;
  adStack_4b0[0x2a] = (adStack_4b0[0x2a] - dVar64) + dVar59 + dVar16;
  dVar30 = adStack_6b0[6] * 34143562.115192875;
  dVar62 = adStack_6b0[8] * -4.470666408692084;
  local_148 = adStack_6b0[1] * adStack_6b0[7];
  uStack_140 = 0;
  dVar17 = adStack_6b0[7] * -4323.663734083463;
  dStack_160 = adStack_6b0[6];
  local_88 = adStack_6b0[6];
  dStack_80 = adStack_6b0[8];
  dVar49 = adStack_6b0[8] * -150.1634478502138;
  dVar18 = adStack_6b0[2] * -150.1634478502138;
  dVar22 = adStack_6b0[8] * adStack_6b0[2];
  dVar73 = adStack_6b0[7] * adStack_6b0[7];
  dVar19 = dVar73 * 20212.492175153773 +
           (0.0026797964842987356 -
           ((dStack_5a0 + dStack_570) - (local_578 + local_578)) * 0.0006666666666666666) *
           -150.1634478502138 * dVar22;
  uStack_180 = 0;
  dVar41 = dVar73 * 7542547.463429146 + dVar22 * -150.1634478502138;
  adStack_4b0[2] = dVar63 + (adStack_4b0[2] - dVar36) + dVar72 + dVar61 + dVar49 + dVar62;
  adStack_4b0[7] = (((adStack_4b0[7] - dVar72) - dVar61) - (dVar49 + dVar49)) - (dVar62 + dVar62);
  adStack_4b0[8] = dVar62 + dVar49 + adStack_4b0[8];
  dVar63 = adStack_6b0[1] * adStack_6b0[6] * 4271828.084344627 +
           adStack_6b0[4] * adStack_6b0[3] * -145376.75098299314;
  dVar72 = local_5d8 * adStack_6b0[5] * 1860366.9115799016 + dVar10 * -1341454.8115373214;
  dVar49 = adStack_6b0[5] * adStack_6b0[3] * 374.95779706744673 +
           (0.00434360147634811 -
           (dStack_580 * 2.0 + -(local_588 + local_598)) * 0.0006666666666666666) *
           -1829063.0057653617 * adStack_6b0[6] * adStack_6b0[6];
  dVar62 = dVar73 * -81.82756742036453 +
           (-0.0003643959615980579 -
           (local_578 * -2.0 + dStack_5a0 + dStack_570) * 0.0006666666666666666) *
           -4.470666408692084 * dVar22;
  local_548 = dVar62 * -2.0 +
              (((((adStack_4b0[0x57] - dVar29) - dVar14) - dVar21) - dVar74) - (dVar19 + dVar19));
  dVar61 = dVar71 * 64119709.90701692 + adStack_6b0[6] * adStack_6b0[6] * -16.310006106092114;
  dStack_550 = adStack_6b0[5] * adStack_6b0[7] * 32500000.0 +
               adStack_6b0[6] * adStack_6b0[2] * -0.6025543492746578;
  dVar65 = adStack_6b0[5] * adStack_6b0[3] * 86324.17110758815 +
           adStack_6b0[6] * adStack_6b0[6] * -1829063.0057653617;
  dVar66 = dVar73 * 224556.7351007675 + dVar22 * -4.470666408692084;
  local_538 = dVar66 * -2.0 +
              ((((((double)local_628._0_8_ - dVar28) - dVar61) - dStack_550) - dVar70) -
              (dVar41 + dVar41));
  dVar36 = adStack_6b0[7] * 449113.470201535;
  adStack_4b0[0x34] = dVar46 + adStack_4b0[0x34] + dVar51 + dVar30 + dVar50 + dVar36;
  dVar22 = adStack_6b0[6] * -7.112730406981104e-05;
  adStack_4b0[0xe] = (adStack_4b0[0xe] + dVar53) - dVar22;
  dVar56 = adStack_6b0[8] * 6362141.693962547;
  adStack_4b0[0x17] = dVar12 + adStack_4b0[0x17] + dVar56;
  adStack_4b0[0x1a] = dVar11 + dVar11 + ((dVar67 + dVar37 + adStack_4b0[0x1a]) - dVar12) + dVar56;
  local_1a8 = adStack_6b0[3];
  uStack_1a0 = 0;
  dVar71 = adStack_6b0[3] * -7.112730406981104e-05;
  adStack_4b0[0x2c] = (((adStack_4b0[0x2c] - dVar64) + dVar47 + dVar38) - dVar58) - dVar71;
  local_1c8 = adStack_6b0[4];
  uStack_1c0 = 0;
  adStack_6b0[2] = adStack_6b0[2] * -4.470666408692084;
  dVar73 = adStack_6b0[4] * 6362141.693962547;
  adStack_4b0[0x3e] = adStack_4b0[0x3e] + dVar18 + adStack_6b0[2];
  local_4f8 = dVar27 + ((local_4f8 - dVar69) - dVar52) + dVar17;
  dStack_4e0 = ((dVar52 + dStack_4e0 + dVar69) - dVar27) - dVar17;
  local_4c8 = (local_4c8 - dVar27) + dVar17;
  local_4c0[0] = local_4c0[0] - dVar17;
  dVar10 = adStack_6b0[8] * 3347824.3674030215;
  local_178 = adStack_6b0[8];
  uStack_170 = 0;
  adStack_4b0[0x15] = dVar13 + ((adStack_4b0[0x15] - dVar67) - dVar12) + dVar10;
  adStack_4b0[0x18] =
       ((((dVar12 + (adStack_4b0[0x18] - dVar37) + dVar67) - dVar13) - dVar11) - dVar56) - dVar10;
  adStack_4b0[0x1b] = dVar10 + ((adStack_4b0[0x1b] - dVar13) - dVar11);
  adStack_4b0[0x1c] = (adStack_4b0[0x1c] - dVar56) - dVar10;
  local_1b8 = local_5a8 + local_578;
  uStack_1b0 = 0;
  local_138 = dStack_570;
  uStack_130 = 0;
  local_1d8 = dStack_580;
  uStack_1d0 = 0;
  dVar37 = adStack_6b0[8] * 5672469.694980093;
  adStack_4b0[0x23] = ((((dVar32 + adStack_4b0[0x23]) - dVar26) - dVar54) - dVar55) - dVar37;
  adStack_4b0[0x24] = dVar37 + dVar54 + dVar54 + dVar26 + dVar32 + adStack_4b0[0x24] + dVar55;
  adStack_4b0[0x25] = dVar37 + (adStack_4b0[0x25] - dVar55);
  adStack_4b0[0x26] = adStack_4b0[0x26] - dVar37;
  adStack_6b0[1] = adStack_6b0[1] * -4323.663734083463;
  dVar37 = adStack_6b0[6] * -5282.492258864639;
  local_500 = adStack_4b0[0x30] - dVar71;
  adStack_4b0[0x33] = dVar46 + adStack_4b0[0x33] + adStack_6b0[1];
  adStack_4b0[0x36] = ((adStack_4b0[0x36] - dVar46) - dVar48) - adStack_6b0[1];
  adStack_4b0[0x37] = (adStack_4b0[0x37] - dVar51) - dVar37;
  dVar11 = adStack_6b0[4] * 3347824.3674030215;
  dVar12 = adStack_6b0[5] * 5672469.694980093;
  adStack_4b0[0x3d] = adStack_4b0[0x3d] + dVar11;
  local_528 = adStack_6b0[5] * adStack_6b0[8] * 5672469.694980093 +
              adStack_6b0[7] * adStack_6b0[6] * -5282.492258864639;
  local_158 = adStack_6b0[5] * adStack_6b0[8] * 12599.866574880663 +
              (0.0022212311836643283 -
              ((local_578 + dStack_580) - (local_588 + dStack_570)) * 0.0006666666666666666) *
              -5282.492258864639 * adStack_6b0[7] * adStack_6b0[6];
  dStack_150 = adStack_6b0[5];
  local_558 = (dVar61 + dVar61 +
               dVar65 * 2.0 + ((dVar72 + dVar68 + (double)local_638._8_8_) - dVar63) + dStack_550) -
              dVar70;
  adStack_4b0[0x40] = (adStack_4b0[0x40] - dVar73) - dVar11;
  adStack_4b0[0x41] = adStack_4b0[0x41] - dVar12;
  adStack_4b0[0x55] = ((((dVar60 + dVar24) - dVar42) - dVar49) - dVar21) - local_158;
  dVar13 = adStack_6b0[3] * -43.95116952269832;
  local_188 = (((dVar48 + dVar48 + adStack_4b0[0x38] + dVar51) - dVar30) + dVar37) - dVar13;
  local_510 = ((((((adStack_4b0[0x39] - dVar46) - dVar48) - dVar51) - dVar30) - (dVar50 + dVar50)) -
              (dVar36 + dVar36)) + adStack_6b0[1] + dVar37 + dVar13;
  local_508 = (((dVar36 + dVar50 + adStack_4b0[0x3a]) - adStack_6b0[1]) - dVar37) - dVar13;
  dVar60 = adStack_6b0[8] * 1000000.0;
  dVar36 = adStack_6b0[6] * 1000000.0;
  dVar10 = adStack_6b0[7] * -5282.492258864639;
  dVar46 = adStack_6b0[8] * 23496864.50220335;
  dStack_190 = (((dVar58 + dVar58 +
                  dVar39 + dVar39 + ((dVar47 + dVar64 + adStack_4b0[0x2e]) - dVar38) + dVar59) -
                dVar16) + dVar71 + dVar10) - dVar60;
  dVar50 = adStack_6b0[7] * -1032.714674988212;
  dVar37 = adStack_6b0[7] * -43.95116952269832;
  adStack_4b0[0xd] = ((adStack_4b0[0xd] + dVar53) - dVar57) + dVar15 + dVar22 + dVar37 + dVar50;
  adStack_4b0[0x10] =
       ((((dVar57 + dVar57 + (adStack_4b0[0x10] - dVar53)) - dVar15) + dVar22) - dVar37) - dVar50;
  adStack_4b0[0x11] = dVar37 + (adStack_4b0[0x11] - dVar15) + dVar50;
  adStack_4b0[0x12] = ((adStack_4b0[0x12] - dVar22) - dVar37) - dVar50;
  adStack_4b0[0x2b] = ((adStack_4b0[0x2b] + dVar38) - dVar39) + dVar16 + dVar71 + dVar60 + dVar46;
  adStack_4b0[0x2d] = local_198 - dVar10;
  adStack_4b0[0x2e] = dStack_190 - dVar46;
  adStack_4b0[0x2f] = local_168 + dVar10 + dVar60 + dVar46;
  dVar37 = adStack_6b0[3] * -1032.714674988212;
  adStack_4b0[0x30] = (((adStack_4b0[0x30] - dVar71) - dVar10) - dVar60) - dVar46;
  adStack_4b0[0x35] = adStack_4b0[0x35] + dVar30 + dVar13 + dVar37;
  adStack_4b0[0x38] = local_188 - dVar37;
  adStack_4b0[0x39] = local_510 + dVar37;
  adStack_4b0[0x3a] = local_508 - dVar37;
  dVar37 = adStack_6b0[6] * 23496864.50220335;
  adStack_4b0[0x3f] = adStack_4b0[0x3f] + dVar73 + dVar36 + dVar37;
  adStack_4b0[0x42] = ((adStack_4b0[0x42] + dVar73 + dVar12) - dVar36) - dVar37;
  adStack_4b0[0x43] =
       ((adStack_4b0[0x43] - (dVar18 + dVar18)) - (adStack_6b0[2] + adStack_6b0[2])) + dVar11 +
       dVar12 + dVar36 + dVar37;
  adStack_4b0[0x44] =
       (((((dVar18 + adStack_4b0[0x44] + adStack_6b0[2]) - dVar73) - dVar11) - dVar12) - dVar36) -
       dVar37;
  adStack_6b0[7] = adStack_6b0[3] * adStack_6b0[7];
  dVar10 = adStack_6b0[6] * adStack_6b0[8] * 0.0 +
           (0.0 - ((local_578 + local_598) - (dStack_570 + dStack_580)) * 0.0006666666666666666) *
           -43.95116952269832 * adStack_6b0[7];
  dVar60 = adStack_6b0[8] * adStack_6b0[4] * 5648.9319335705395 +
           (0.0008878978503309949 -
           ((local_598 + dStack_580) - (dStack_570 + dStack_590)) * 0.0006666666666666666) *
           -7.112730406981104e-05 * adStack_6b0[6] * adStack_6b0[3];
  adStack_4b0[0x52] = dVar62 + dVar19 + dVar29 + (dVar35 - dVar24) + dVar21 + dVar74;
  dVar36 = adStack_6b0[6] * adStack_6b0[8] * 50223.15555469926 +
           (0.0021374407444869816 -
           ((local_578 + local_598) - (dStack_580 + dStack_570)) * 0.0006666666666666666) *
           -1032.714674988212 * adStack_6b0[7];
  dVar35 = adStack_6b0[8] * adStack_6b0[4] * 5952.53958938735 +
           (0.0017780322191766774 -
           ((local_5a8 + local_578) - (dStack_570 + dStack_590)) * 0.0006666666666666666) *
           -4323.663734083463 * local_148;
  adStack_4b0[0x51] = dVar29 + ((adStack_4b0[0x51] - dVar42) - dVar40) + dVar35;
  dVar46 = adStack_6b0[6] * adStack_6b0[8] * 1000000.0 + adStack_6b0[7] * -43.95116952269832;
  dVar11 = adStack_6b0[8] * adStack_6b0[4] * 6362141.693962547 +
           adStack_6b0[6] * adStack_6b0[3] * -7.112730406981104e-05;
  adStack_6b0[0xc] = dVar28 + ((dVar45 + dVar9) - dVar68) + dStack_550 + dVar70 + dVar41 + dVar66;
  dVar37 = dVar70 + ((dVar33 + 0.0 + dVar63) - dVar65) + dVar11;
  auVar2._8_4_ = SUB84(dVar37,0);
  auVar2._0_8_ = adStack_6b0[0xc];
  auVar2._12_4_ = (int)((ulong)dVar37 >> 0x20);
  adStack_6b0[0xd] = auVar2._8_8_;
  dVar33 = adStack_6b0[6] * adStack_6b0[8] * 23496864.50220335 + adStack_6b0[7] * -1032.714674988212
  ;
  dVar9 = adStack_6b0[8] * adStack_6b0[4] * 3347824.3674030215 + local_148 * -4323.663734083463;
  adStack_6b0[0xb] = dVar28 + (((0.0 - dVar8) - dVar72) - dVar63) + dVar9;
  adStack_6b0[0xd] = adStack_6b0[0xd] + dVar46 + dVar33;
  dVar37 = ((((dVar63 + (adStack_6b0[0xe] - dVar68) + dVar72) - dVar28) - dVar61) - dVar11) - dVar9;
  auVar3._8_4_ = SUB84(dVar37,0);
  auVar3._0_8_ = adStack_6b0[0xd];
  auVar3._12_4_ = (int)((ulong)dVar37 >> 0x20);
  adStack_6b0[0xe] = auVar3._8_8_;
  local_638._8_8_ = ((local_558 + dVar11 + local_528) - dVar46) - dVar33;
  local_638._0_8_ =
       (((((double)local_638._0_8_ + dVar68) - dVar72) - dVar65) - dStack_550) - local_528;
  local_628._8_8_ =
       (((((dVar66 + (0.0 - dVar25) + dVar41) - dVar11) - dVar9) - local_528) - dVar46) - dVar33;
  local_628._0_8_ = local_538 + dVar9 + local_528 + dVar46 + dVar33;
  adStack_4b0[0x53] =
       dVar60 + dVar74 + ((adStack_4b0[0x53] + dVar34 + dVar40) - dVar49) + dVar10 + dVar36;
  adStack_4b0[0x54] = ((((dVar40 + dStack_530 + dVar42) - dVar29) - dVar14) - dVar60) - dVar35;
  adStack_4b0[0x56] =
       ((((dVar14 + dVar14 +
           dVar49 * 2.0 + ((dVar42 + dVar24 + (adStack_4b0[0x56] - dVar34)) - dVar40) + dVar21) -
         dVar74) + dVar60 + local_158) - dVar10) - dVar36;
  adStack_4b0[0x57] = local_548 + dVar35 + local_158 + dVar10 + dVar36;
  adStack_4b0[0x58] =
       (((((dVar62 + adStack_4b0[0x58] + dVar19) - dVar60) - dVar35) - local_158) - dVar10) - dVar36
  ;
  if (iVar23 == 0) {
    local_128[0] = 2.8916149455543745;
    local_128[1] = 3.3887808219431252;
    local_128[2] = 4.665255136408125;
    local_128[3] = 1.5;
    local_128[4] = 1.506900950283125;
    local_128[5] = 2.9628176357525002;
    local_128[6] = 5.2821630604062495;
    local_128[7] = 7.4795990834;
    local_128[8] = 3.1861205355625004;
    local_d8[0] = 0.00049010354654;
    local_d8[1] = 0.000340356715215;
    local_d8[2] = 0.0011616005819375;
    local_d8[3] = 0.0;
    local_d8[4] = -1.20361935e-05;
    local_d8[5] = 0.00046729736768999996;
    local_d8[6] = 0.0009643321552500001;
    local_d8[7] = 0.0013043066091500003;
    local_d8[8] = 0.00037292866150000014;
    pdVar5 = local_78;
    local_78[0] = 1.9113420244977917;
    local_78[1] = 2.254512984911125;
    local_78[2] = -16.528347679998124;
    local_78[3] = 18.481084666666668;
    local_78[4] = 21.009669090999374;
    local_78[5] = 4.94295186894925;
    local_78[6] = 4.3818731557687505;
    local_78[7] = -6.101694818407498;
    local_78[8] = 2.079423216195834;
  }
  else {
    local_128[0] = 3.8916149455543745;
    local_128[1] = 4.388780821943126;
    local_128[2] = 5.665255136408124;
    local_128[3] = 2.5;
    local_128[4] = 2.506900950283125;
    local_128[5] = 3.9628176357525002;
    local_128[6] = 6.28216306040625;
    local_128[7] = 8.4795990834;
    local_128[8] = 4.1861205355625;
    local_d8[0] = 0.00049010354654;
    local_d8[1] = 0.000340356715215;
    local_d8[2] = 0.0011616005819375;
    local_d8[3] = 0.0;
    local_d8[4] = -1.20361935e-05;
    local_d8[5] = 0.00046729736768999996;
    local_d8[6] = 0.0009643321552500001;
    local_d8[7] = 0.0013043066091500003;
    local_d8[8] = 0.00037292866150000014;
    pdVar5 = &local_5a8;
  }
  dVar36 = 0.0;
  dVar33 = 0.0;
  dVar37 = 0.0;
  lVar4 = 0;
  dVar35 = 0.0;
  do {
    dVar9 = *(double *)((long)adStack_6b0 + lVar4 + 8);
    dVar35 = dVar35 + *(double *)((long)local_128 + lVar4) * dVar9;
    dVar8 = *(double *)((long)pdVar5 + lVar4);
    dVar10 = *(double *)((long)adStack_6b0 + lVar4 + 0x58);
    dVar36 = dVar36 + dVar9 * *(double *)((long)local_d8 + lVar4);
    dVar33 = dVar33 + dVar10 * dVar8;
    dVar37 = dVar37 + (*(double *)((long)local_128 + lVar4) - dVar8) * 0.0006666666666666666 *
                      dVar10 + dVar8 * *(double *)((long)adStack_4b0 + lVar4 + 0x288);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x48);
  dVar33 = dVar33 * (1.0 / dVar35);
  dVar9 = (1.0 / dVar35) * 1500.0;
  dVar35 = dVar33 * dVar9;
  dVar9 = -dVar9;
  lVar4 = 0;
  do {
    dVar8 = 0.0;
    lVar7 = 0;
    do {
      dVar8 = dVar8 + pdVar5[lVar7] * pdVar6[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 9);
    adStack_4b0[lVar4 * 10] = local_128[lVar4] * dVar35 + dVar8 * dVar9;
    lVar4 = lVar4 + 1;
    pdVar6 = pdVar6 + 10;
  } while (lVar4 != 9);
  pdVar6 = &local_4f8;
  local_1e0 = dVar9 * dVar37 + (dVar35 * dVar36 - dVar33);
  lVar4 = 0;
  iVar23 = 0;
  do {
    iVar31 = 0;
    lVar7 = 0;
    do {
      iVar23 = iVar23 + (uint)(pdVar6[lVar7] != 0.0);
      iVar31 = iVar31 + (uint)((pdVar6 + lVar7)[1] != 0.0);
      lVar7 = lVar7 + 2;
    } while (lVar7 != 10);
    iVar23 = iVar31 + iVar23;
    lVar4 = lVar4 + 1;
    pdVar6 = pdVar6 + 10;
  } while (lVar4 != 10);
  *nJdata = iVar23 * NCELLS;
  return;
}

Assistant:

void
SPARSITY_INFO(int* nJdata, const int* consP, int NCELLS)
{
  amrex::GpuArray<amrex::Real, 100> Jac = {0.0};
  amrex::GpuArray<amrex::Real, 9> conc = {0.0};
  for (int n = 0; n < 9; n++) {
    conc[n] = 1.0 / 9.000000;
  }
  aJacobian(&Jac[0], &conc[0], 1500.0, *consP);

  int nJdata_tmp = 0;
  for (int k = 0; k < 10; k++) {
    for (int l = 0; l < 10; l++) {
      if (Jac[10 * k + l] != 0.0) {
        nJdata_tmp = nJdata_tmp + 1;
      }
    }
  }

  *nJdata = NCELLS * nJdata_tmp;
}